

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O2

ZyanStatus ZyanStringAppendDecU(ZyanString *string,ZyanU64 value,ZyanU8 padding_length)

{
  ZyanUSize ZVar1;
  ZyanStatus ZVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong __n;
  long lVar7;
  size_t __n_00;
  undefined2 auStack_3a [3];
  undefined2 auStack_34 [2];
  
  if (string == (ZyanString *)0x0) {
    return 0x80100004;
  }
  uVar4 = (ulong)padding_length;
  lVar6 = -uVar4;
  lVar5 = -2;
  while (lVar6 = lVar6 + 2, 99 < value) {
    *(undefined2 *)((long)auStack_34 + lVar5) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + ((value / 100) * 0x7fffffffffffff9c + value) * 2);
    lVar5 = lVar5 + -2;
    value = value / 100;
  }
  *(undefined2 *)((long)auStack_34 + lVar5) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + value * 2);
  lVar7 = -(ulong)(value < 10);
  __n = lVar7 - lVar5;
  uVar3 = uVar4;
  if (uVar4 < __n) {
    uVar3 = __n;
  }
  ZVar1 = (string->vector).size;
  uVar3 = uVar3 + ZVar1;
  if (((string->vector).capacity < uVar3) &&
     (ZVar2 = ZyanStringResize(string,uVar3 - 1), (int)ZVar2 < 0)) {
    return ZVar2;
  }
  if (__n < uVar4) {
    __n_00 = -(lVar7 + lVar6);
    memset((void *)((long)(string->vector).data + (ZVar1 - 1)),0x30,__n_00);
  }
  else {
    __n_00 = 0;
  }
  memcpy((void *)((long)(string->vector).data + __n_00 + ZVar1 + -1),
         (void *)((long)auStack_34 + lVar5 + (ulong)(value < 10)),__n);
  (string->vector).size = uVar3;
  *(undefined1 *)((long)(string->vector).data + (uVar3 - 1)) = 0;
  return 0x100000;
}

Assistant:

ZyanStatus ZyanStringAppendDecU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length)
{
#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    return ZyanStringAppendDecU64(string, value, padding_length);
#else
    // Working with 64-bit values is slow on non 64-bit systems
    if (value & 0xFFFFFFFF00000000)
    {
        return ZyanStringAppendDecU64(string, value, padding_length);
    }
    return ZyanStringAppendDecU32(string, (ZyanU32)value, padding_length);
#endif
}